

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

QSize __thiscall
QItemDelegate::sizeHint(QItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  QMetaType QVar3;
  anon_union_24_3_e3d07ef4_for_data *paVar4;
  QSize QVar5;
  QItemDelegatePrivate *this_00;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  QSize t;
  QRect local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_78._8_8_ = local_78._0_8_;
  local_68._8_8_ = local_68._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,index,0xd);
  }
  if (puStack_40 < (undefined1 *)0x4) {
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (undefined1  [16])rect(this,option,index,1);
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [16])rect(this,option,index,10);
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = (undefined1  [16])
               QItemDelegatePrivate::displayRect
                         (this_00,index,option,(QRect *)local_68,(QRect *)local_78);
    doLayout((QItemDelegate *)this_00,option,(QRect *)local_78,(QRect *)local_68,(QRect *)local_88,
             true);
    local_98 = (QRect)QRect::operator|((QRect *)local_68,(QRect *)local_88);
    auVar6 = QRect::operator|(&local_98,(QRect *)local_78);
    QVar5.wd.m_i = (auVar6._8_4_ - auVar6._0_4_) + 1;
    QVar5.ht.m_i = (auVar6._12_4_ - auVar6._4_4_) + 1;
  }
  else {
    local_78._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QSize>::metaType;
    local_68._0_8_ = (ulong)puStack_40 & 0xfffffffffffffffc;
    bVar2 = comparesEqual((QMetaType *)local_68,(QMetaType *)local_78);
    if (bVar2) {
      if (((ulong)puStack_40 & 1) == 0) {
        paVar4 = &local_58;
      }
      else {
        paVar4 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      local_68._0_8_ = paVar4->shared;
    }
    else {
      local_68._0_8_ = 0xffffffffaaaaaaaa;
      local_68._0_4_ = -1;
      paVar4 = &local_58;
      QVar3.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_40 & 1) != 0) {
        paVar4 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar3,paVar4,(QMetaType)local_78._0_8_,local_68);
    }
    QVar5 = (QSize)local_68._0_8_;
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSize QItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                              const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);
    QRect decorationRect = rect(option, index, Qt::DecorationRole);
    QRect checkRect = rect(option, index, Qt::CheckStateRole);
    QRect displayRect = d->displayRect(index, option, decorationRect, checkRect);

    doLayout(option, &checkRect, &decorationRect, &displayRect, true);

    return (decorationRect|displayRect|checkRect).size();
}